

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::SSARewriter::GetValueAtBlock(SSARewriter *this,uint32_t var_id,BasicBlock *bb)

{
  bool bVar1;
  pointer ppVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_60;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_58;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> *local_50;
  const_iterator *var_it;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *current_defs;
  _Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_false>
  local_38;
  _Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_false>
  *local_30;
  iterator *bb_it;
  BasicBlock *bb_local;
  SSARewriter *pSStack_18;
  uint32_t var_id_local;
  SSARewriter *this_local;
  
  bb_it = (iterator *)bb;
  bb_local._4_4_ = var_id;
  pSStack_18 = this;
  if (bb == (BasicBlock *)0x0) {
    __assert_fail("bb != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                  ,0xf4,
                  "uint32_t spvtools::opt::SSARewriter::GetValueAtBlock(uint32_t, BasicBlock *)");
  }
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<spvtools::opt::BasicBlock_*,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>_>
       ::find(&this->defs_at_block_,(key_type *)&bb_it);
  local_30 = &local_38;
  current_defs = (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)std::
                    unordered_map<spvtools::opt::BasicBlock_*,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>_>
                    ::end(&this->defs_at_block_);
  bVar1 = std::__detail::operator!=
                    (&local_38,
                     (_Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_false>
                      *)&current_defs);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<spvtools::opt::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<spvtools::opt::BasicBlock_*const,_std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>,_false,_false>
                           *)local_30);
    var_it = (const_iterator *)&ppVar2->second;
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *)var_it,(key_type *)((long)&bb_local + 4));
    local_50 = &local_58;
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                *)var_it);
    bVar1 = std::__detail::operator!=(&local_58,&local_60);
    if (bVar1) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
               operator->((_Node_const_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)local_50);
      return pvVar3->second;
    }
  }
  return 0;
}

Assistant:

uint32_t SSARewriter::GetValueAtBlock(uint32_t var_id, BasicBlock* bb) {
  assert(bb != nullptr);
  const auto& bb_it = defs_at_block_.find(bb);
  if (bb_it != defs_at_block_.end()) {
    const auto& current_defs = bb_it->second;
    const auto& var_it = current_defs.find(var_id);
    if (var_it != current_defs.end()) {
      return var_it->second;
    }
  }
  return 0;
}